

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int file_read(int pi,uint handle,char *buf,uint count)

{
  undefined8 in_RDX;
  int in_ESI;
  int in_EDI;
  int bytes;
  int in_stack_00000ff0;
  int in_stack_00000ff4;
  void *in_stack_00000ff8;
  int in_stack_00001004;
  undefined4 local_18;
  
  local_18 = pigpio_command(bytes,in_EDI,in_ESI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  if (0 < local_18) {
    local_18 = recvMax(in_stack_00001004,in_stack_00000ff8,in_stack_00000ff4,in_stack_00000ff0);
  }
  _pmu(0);
  return local_18;
}

Assistant:

int file_read(int pi, unsigned handle, char *buf, unsigned count)
{
   int bytes;

   bytes = pigpio_command
      (pi, PI_CMD_FR, handle, count, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}